

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

CommaSeparatedList * __thiscall
soul::StructuralParser::parseCommaSeparatedListOfExpressions
          (StructuralParser *this,bool canContainTypes,bool canContainProcessors)

{
  SourceCodeText *o;
  Scope *pSVar1;
  bool bVar2;
  PoolItem *pPVar3;
  Expression *pEVar4;
  DestructorFn *pDVar5;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pDVar5 = (DestructorFn *)(this->super_SOULTokeniser).location.location.data;
  pSVar1 = this->currentScope;
  pPVar3 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x68);
  pPVar3->item = &PTR__ASTObject_00301658;
  *(undefined4 *)&pPVar3->field_0x18 = 0x2f;
  pPVar3[1].size = (size_t)o;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pPVar3[1].destructor = pDVar5;
  pPVar3[1].item = pSVar1;
  *(undefined4 *)&pPVar3[1].field_0x18 = 4;
  pPVar3->item = &PTR__CommaSeparatedList_00302540;
  pPVar3[2].size = (size_t)&pPVar3[2].field_0x18;
  pPVar3[2].destructor = (DestructorFn *)0x0;
  pPVar3[2].item = (void *)0x4;
  pPVar3->destructor =
       PoolAllocator::allocate<soul::AST::CommaSeparatedList,_soul::AST::Context>::
       anon_class_1_0_00000001::__invoke;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2acfd0);
  if (bVar2) {
LAB_001fe060:
    return (CommaSeparatedList *)&pPVar3->item;
  }
  pEVar4 = parseExpression(this,false);
  pDVar5 = pPVar3[2].destructor;
  if (pDVar5 < (DestructorFn *)0x10000) {
    do {
      if (pEVar4->kind == type && !canContainTypes) {
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,"Type references are not allowed in this context");
        AST::Context::throwError(&(pEVar4->super_Statement).super_ASTObject.context,&local_a0,false)
        ;
      }
      if (pEVar4->kind == processor && !canContainProcessors) {
        CompileMessageHelpers::createMessage<>
                  (&local_d8,syntax,error,"Processor references are not allowed in this context");
        AST::Context::throwError(&(pEVar4->super_Statement).super_ASTObject.context,&local_d8,false)
        ;
      }
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar3 + 2),
                 (size_t)(pDVar5 + 1));
      pDVar5 = pPVar3[2].destructor;
      *(Expression **)(pPVar3[2].size + (long)pDVar5 * 8) = pEVar4;
      pPVar3[2].destructor = pDVar5 + 1;
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2acfd0);
      if (bVar2) goto LAB_001fe060;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d49);
      pEVar4 = parseExpression(this,false);
      pDVar5 = pPVar3[2].destructor;
    } while (pDVar5 < (DestructorFn *)0x10000);
  }
  CompileMessageHelpers::createMessage<>
            (&local_68,syntax,error,"Initialiser list exceeds max length limit");
  AST::Context::throwError(&(pEVar4->super_Statement).super_ASTObject.context,&local_68,false);
}

Assistant:

AST::CommaSeparatedList& parseCommaSeparatedListOfExpressions (bool canContainTypes, bool canContainProcessors)
    {
        auto& list = allocate<AST::CommaSeparatedList> (getContext());

        if (! matchIf (Operator::closeParen))
        {
            for (;;)
            {
                auto& e = parseExpression();

                if (list.items.size() >= AST::maxInitialiserListLength)
                    e.context.throwError (Errors::tooManyInitialisers());

                if (! canContainTypes && e.kind == AST::ExpressionKind::type)
                    e.context.throwError (Errors::typeReferenceNotAllowed());

                if (! canContainProcessors && e.kind == AST::ExpressionKind::processor)
                    e.context.throwError (Errors::processorReferenceNotAllowed());

                list.items.push_back (e);

                if (matchIf (Operator::closeParen))
                    break;

                expect (Operator::comma);
            }
        }

        return list;
    }